

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

uint sum<unsigned_int>(vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                       *tensor)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  double dVar7;
  
  pvVar2 = (tensor->
           super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(tensor->
                             super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
      uVar3 = uVar3 + 1) {
    lVar4 = 8;
    for (uVar6 = 0;
        lVar1 = *(long *)&pvVar2[uVar3].
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data,
        uVar6 < (ulong)(((long)*(pointer *)
                                ((long)&pvVar2[uVar3].
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar1) / 0x18);
        uVar6 = uVar6 + 1) {
      dVar7 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,double>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )*(uint **)(lVar1 + -8 + lVar4),
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )*(uint **)(lVar1 + lVar4),0.0);
      uVar5 = (ulong)((double)(uVar5 & 0xffffffff) + dVar7);
      pvVar2 = (tensor->
               super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    }
  }
  return (uint)uVar5;
}

Assistant:

T sum(std::vector<std::vector<std::vector<T> > > tensor){
    T result(0);
    for(int i=0; i<tensor.size(); i++){
        for(int j=0; j<tensor[i].size(); j++){
            result += accumulate(tensor[i][j].begin(), tensor[i][j].end(), 0.0);
        }
    }
    return result;
}